

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::anon_unknown_0::decodeHDREndpointMode7
               (UVec4 *e0,UVec4 *e1,deUint32 v0,deUint32 v1,deUint32 v2,deUint32 v3)

{
  deUint32 dVar1;
  deUint32 dVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  deUint32 local_b8;
  deUint32 local_b4;
  deUint32 local_b0;
  Vector<unsigned_int,_4> local_a8;
  Vector<unsigned_int,_4> local_98;
  deUint32 *local_88;
  deInt32 *S;
  deInt32 *B;
  deInt32 *G;
  deInt32 *R;
  deUint32 local_60;
  deUint32 x6;
  deUint32 x5;
  deUint32 x4;
  deUint32 x3;
  deUint32 x2;
  deUint32 x1;
  deUint32 x0;
  deInt32 scale;
  deInt32 blue;
  deInt32 green;
  deInt32 red;
  deUint32 mode;
  deUint32 majComp;
  deUint32 m23;
  deUint32 m10;
  deUint32 v3_local;
  deUint32 v2_local;
  deUint32 v1_local;
  deUint32 v0_local;
  UVec4 *e1_local;
  UVec4 *e0_local;
  
  m23 = v3;
  m10 = v2;
  v3_local = v1;
  v2_local = v0;
  _v1_local = e1;
  e1_local = e0;
  dVar1 = getBit(v1,7);
  dVar2 = getBit(m10,7);
  majComp = dVar1 | dVar2 << 1;
  mode = getBits(v2_local,6,7);
  if (majComp == 3) {
    local_b4 = mode;
    if (mode == 3) {
      local_b4 = 0;
    }
    local_b0 = local_b4;
  }
  else {
    local_b0 = majComp;
  }
  red = local_b0;
  local_b8 = mode;
  if ((majComp == 3) && (local_b8 = 5, mode != 3)) {
    local_b8 = 4;
  }
  green = local_b8;
  blue = getBits(v2_local,0,5);
  scale = getBits(v3_local,0,4);
  x0 = getBits(m10,0,4);
  x1 = getBits(m23,0,4);
  x2 = getBit(v3_local,6);
  x3 = getBit(v3_local,5);
  x4 = getBit(m10,6);
  x5 = getBit(m10,5);
  x6 = getBit(m23,7);
  local_60 = getBit(m23,6);
  R._4_4_ = getBit(m23,5);
  G = &blue;
  B = &scale;
  S = (deInt32 *)&x0;
  local_88 = &x1;
  switch(green) {
  case 0:
    blue = x6 << 6 | x5 << 10 | x4 << 7 | x3 << 8 | x2 << 9 | blue;
    x1 = R._4_4_ << 5 | local_60 << 6 | x1;
    break;
  case 1:
    scale = x3 << 5 | scale;
    x0 = x5 << 5 | x0;
    blue = R._4_4_ << 9 | local_60 << 10 | x6 << 6 | blue;
    break;
  case 2:
    blue = x5 << 6 | x4 << 7 | x3 << 8 | x2 << 9 | blue;
    x1 = R._4_4_ << 5 | local_60 << 6 | x6 << 7 | x1;
    break;
  case 3:
    scale = x3 << 5 | scale;
    x0 = x5 << 5 | x0;
    blue = x6 << 6 | blue;
    x1 = R._4_4_ << 5 | local_60 << 6 | x1;
    break;
  case 4:
    scale = x3 << 5 | x2 << 6 | scale;
    x0 = x5 << 5 | x4 << 6 | x0;
    blue = local_60 << 7 | x6 << 6 | blue;
    x1 = R._4_4_ << 5 | x1;
    break;
  case 5:
    scale = x3 << 5 | x2 << 6 | scale;
    x0 = x5 << 5 | x4 << 6 | x0;
    blue = x6 << 6 | blue;
    x1 = R._4_4_ << 5 | local_60 << 6 | x1;
  }
  blue = blue << ((byte)decodeHDREndpointMode7::shiftAmounts[(uint)green] & 0x1f);
  scale = scale << ((byte)decodeHDREndpointMode7::shiftAmounts[(uint)green] & 0x1f);
  x0 = x0 << ((byte)decodeHDREndpointMode7::shiftAmounts[(uint)green] & 0x1f);
  x1 = x1 << ((byte)decodeHDREndpointMode7::shiftAmounts[(uint)green] & 0x1f);
  if (green != 5) {
    scale = blue - scale;
    x0 = blue - x0;
  }
  if (red == 1) {
    std::swap<int>(&blue,&scale);
  }
  else if (red == 2) {
    std::swap<int>(&blue,(int *)&x0);
  }
  uVar3 = de::clamp<int>(blue - x1,0,0xfff);
  uVar4 = de::clamp<int>(scale - x1,0,0xfff);
  uVar5 = de::clamp<int>(x0 - x1,0,0xfff);
  Vector<unsigned_int,_4>::Vector(&local_98,uVar3,uVar4,uVar5,0x780);
  *(undefined8 *)e1_local->m_data = local_98.m_data._0_8_;
  *(undefined8 *)(e1_local->m_data + 2) = local_98.m_data._8_8_;
  uVar3 = de::clamp<int>(blue,0,0xfff);
  uVar4 = de::clamp<int>(scale,0,0xfff);
  uVar5 = de::clamp<int>(x0,0,0xfff);
  Vector<unsigned_int,_4>::Vector(&local_a8,uVar3,uVar4,uVar5,0x780);
  *(undefined8 *)_v1_local->m_data = local_a8.m_data._0_8_;
  *(undefined8 *)(_v1_local->m_data + 2) = local_a8.m_data._8_8_;
  return;
}

Assistant:

void decodeHDREndpointMode7 (UVec4& e0, UVec4& e1, deUint32 v0, deUint32 v1, deUint32 v2, deUint32 v3)
{
	const deUint32 m10		= getBit(v1, 7) | (getBit(v2, 7) << 1);
	const deUint32 m23		= getBits(v0, 6, 7);
	const deUint32 majComp	= m10 != 3	? m10
							: m23 != 3	? m23
							:			  0;
	const deUint32 mode		= m10 != 3	? m23
							: m23 != 3	? 4
							:			  5;

	deInt32			red		= (deInt32)getBits(v0, 0, 5);
	deInt32			green	= (deInt32)getBits(v1, 0, 4);
	deInt32			blue	= (deInt32)getBits(v2, 0, 4);
	deInt32			scale	= (deInt32)getBits(v3, 0, 4);

	{
#define SHOR(DST_VAR, SHIFT, BIT_VAR) (DST_VAR) |= (BIT_VAR) << (SHIFT)
#define ASSIGN_X_BITS(V0,S0, V1,S1, V2,S2, V3,S3, V4,S4, V5,S5, V6,S6) do { SHOR(V0,S0,x0); SHOR(V1,S1,x1); SHOR(V2,S2,x2); SHOR(V3,S3,x3); SHOR(V4,S4,x4); SHOR(V5,S5,x5); SHOR(V6,S6,x6); } while (false)

		const deUint32	x0	= getBit(v1, 6);
		const deUint32	x1	= getBit(v1, 5);
		const deUint32	x2	= getBit(v2, 6);
		const deUint32	x3	= getBit(v2, 5);
		const deUint32	x4	= getBit(v3, 7);
		const deUint32	x5	= getBit(v3, 6);
		const deUint32	x6	= getBit(v3, 5);

		deInt32&		R	= red;
		deInt32&		G	= green;
		deInt32&		B	= blue;
		deInt32&		S	= scale;

		switch (mode)
		{
			case 0: ASSIGN_X_BITS(R,9,  R,8,  R,7,  R,10,  R,6,  S,6,   S,5); break;
			case 1: ASSIGN_X_BITS(R,8,  G,5,  R,7,  B,5,   R,6,  R,10,  R,9); break;
			case 2: ASSIGN_X_BITS(R,9,  R,8,  R,7,  R,6,   S,7,  S,6,   S,5); break;
			case 3: ASSIGN_X_BITS(R,8,  G,5,  R,7,  B,5,   R,6,  S,6,   S,5); break;
			case 4: ASSIGN_X_BITS(G,6,  G,5,  B,6,  B,5,   R,6,  R,7,   S,5); break;
			case 5: ASSIGN_X_BITS(G,6,  G,5,  B,6,  B,5,   R,6,  S,6,   S,5); break;
			default:
				DE_ASSERT(false);
		}

#undef ASSIGN_X_BITS
#undef SHOR
	}

	static const int shiftAmounts[] = { 1, 1, 2, 3, 4, 5 };
	DE_ASSERT(mode < DE_LENGTH_OF_ARRAY(shiftAmounts));

	red		<<= shiftAmounts[mode];
	green	<<= shiftAmounts[mode];
	blue	<<= shiftAmounts[mode];
	scale	<<= shiftAmounts[mode];

	if (mode != 5)
	{
		green	= red - green;
		blue	= red - blue;
	}

	if (majComp == 1)
		std::swap(red, green);
	else if (majComp == 2)
		std::swap(red, blue);

	e0 = UVec4(de::clamp(red	- scale,	0, 0xfff),
			   de::clamp(green	- scale,	0, 0xfff),
			   de::clamp(blue	- scale,	0, 0xfff),
			   0x780);

	e1 = UVec4(de::clamp(red,				0, 0xfff),
			   de::clamp(green,				0, 0xfff),
			   de::clamp(blue,				0, 0xfff),
			   0x780);
}